

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nn.cc
# Opt level: O1

void predict_or_learn_multi<false,true>(nn *n,single_learner *base,example *ec)

{
  uint64_t *puVar1;
  polylabel *ppVar2;
  float *pfVar3;
  uchar **ppuVar4;
  features *pfVar5;
  float fVar6;
  int iVar7;
  uint32_t uVar8;
  vw *pvVar9;
  shared_data *psVar10;
  _func_void_shared_data_ptr_float *p_Var11;
  loss_function *plVar12;
  bool *pbVar13;
  polyprediction *ppVar14;
  shared_data *psVar15;
  uint64_t uVar16;
  _func_void_int_string_v_array<char> *p_Var17;
  float fVar18;
  float fVar19;
  label_t lVar20;
  label_t lVar21;
  label_t lVar22;
  v_array<char> vVar23;
  polylabel *ppVar24;
  undefined4 uVar25;
  bool bVar26;
  ostream *poVar27;
  uint i;
  ulong uVar28;
  polyprediction *ppVar29;
  features *pfVar30;
  char *pcVar31;
  features *pfVar32;
  uint i_1;
  polyprediction *ppVar33;
  ulong uVar34;
  long lVar35;
  example *peVar36;
  uint uVar37;
  byte bVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  features save_nn_output_namespace;
  ostringstream outputStringStream;
  shared_data sd;
  example *peVar42;
  example *peVar43;
  label_t *plVar44;
  undefined4 in_stack_fffffffffffffc68;
  int iVar45;
  undefined4 in_stack_fffffffffffffc6c;
  example *peVar46;
  undefined4 uVar47;
  float fVar48;
  float fVar49;
  float local_374;
  float local_370;
  float local_36c;
  undefined1 *local_310;
  undefined1 local_300 [16];
  char local_2f0 [96];
  float local_290;
  undefined1 local_288 [376];
  shared_data local_110;
  
  bVar38 = 0;
  iVar7 = n->all->raw_prediction;
  if (n->finished_setup == false) {
    finish_setup(n,n->all);
  }
  pvVar9 = n->all;
  memcpy(&local_110,pvVar9->sd,0xe0);
  psVar10 = pvVar9->sd;
  pvVar9->sd = &local_110;
  if (n->dropout == false) {
    fVar39 = 1.0;
  }
  else {
    fVar39 = 2.0;
  }
  fVar6 = (ec->l).simple.label;
  p_Var11 = n->all->set_minmax;
  plVar12 = n->all->loss;
  pbVar13 = n->dropped_out;
  ppVar14 = n->hidden_units_pred;
  ppVar29 = n->hiddenbias_pred;
  peVar42 = ec;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_288);
  n->all->set_minmax = noop_mm;
  n->all->loss = n->squared_loss;
  psVar15 = n->all->sd;
  fVar49 = psVar15->min_label;
  psVar15->min_label = -3.0;
  psVar15 = n->all->sd;
  fVar48 = psVar15->max_label;
  psVar15->max_label = 3.0;
  uVar16 = (ec->super_example_predict).ft_offset;
  if (n->multitask == true) {
    (ec->super_example_predict).ft_offset = 0;
  }
  peVar36 = &n->hiddenbias;
  (n->hiddenbias).super_example_predict.ft_offset = (ec->super_example_predict).ft_offset;
  uVar37 = n->k;
  uVar34 = (ulong)uVar37;
  if (*(code **)(base + 0x40) == (code *)0x0) {
    ec = peVar42;
    ppVar33 = ppVar29;
    if (uVar34 != 0) {
      lVar35 = 0;
      do {
        (**(code **)(base + 0x30))
                  (*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),peVar36);
        fVar40 = (n->hiddenbias).pred.scalar;
        fVar41 = *(float *)((long)&(n->hiddenbias).pred + 4);
        fVar18 = *(float *)((long)&(n->hiddenbias).pred + 8);
        fVar19 = *(float *)((long)&(n->hiddenbias).pred + 0xc);
        *(undefined1 (*) [16])((long)ppVar29 + lVar35 + 0x10) =
             *(undefined1 (*) [16])((long)&(n->hiddenbias).pred + 0x10);
        pfVar3 = (float *)((long)ppVar29 + lVar35);
        *pfVar3 = fVar40;
        pfVar3[1] = fVar41;
        pfVar3[2] = fVar18;
        pfVar3[3] = fVar19;
        puVar1 = &(n->hiddenbias).super_example_predict.ft_offset;
        *puVar1 = *puVar1 + (ulong)*(uint *)(base + 0xe0);
        lVar35 = lVar35 + 0x20;
      } while (uVar34 << 5 != lVar35);
    }
    puVar1 = &(n->hiddenbias).super_example_predict.ft_offset;
    *puVar1 = *puVar1 - (ulong)(uVar37 * *(int *)(base + 0xe0));
    peVar42 = ec;
    peVar46 = peVar36;
  }
  else {
    (**(code **)(base + 0x40))
              (*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),peVar36,uVar34,
               *(undefined8 *)(base + 0xe0),ppVar29,1);
    ppVar33 = ppVar29;
    peVar46 = (example *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68);
  }
  uVar34 = (ulong)n->k;
  ppVar29 = ppVar33;
  if (n->k != 0) {
    uVar28 = 0;
    ec = peVar42;
    do {
      if ((ppVar33->scalar == 0.0) && (!NAN(ppVar33->scalar))) {
        fVar40 = merand48(&n->all->random_state);
        (n->hiddenbias).l.simple.label = fVar40 + -0.5;
        puVar1 = &(n->hiddenbias).super_example_predict.ft_offset;
        *puVar1 = *puVar1 + (ulong)(uint)(*(int *)(base + 0xe0) * (int)uVar28);
        (**(code **)(base + 0x28))
                  (*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),peVar36);
        puVar1 = &(n->hiddenbias).super_example_predict.ft_offset;
        *puVar1 = *puVar1 - (ulong)(uint)(*(int *)(base + 0xe0) * (int)uVar28);
        (n->hiddenbias).l.multi.label = 0x7f7fffff;
      }
      uVar28 = uVar28 + 1;
      uVar34 = (ulong)n->k;
      ppVar33 = ppVar33 + 1;
      peVar42 = ec;
    } while (uVar28 < uVar34);
  }
  if (*(code **)(base + 0x40) == (code *)0x0) {
    iVar45 = (int)uVar34;
    uVar47 = 0;
    if (uVar34 != 0) {
      lVar35 = 0;
      do {
        (**(code **)(base + 0x30))(*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),ec);
        fVar40 = (ec->pred).scalar;
        fVar41 = *(float *)((long)&ec->pred + 4);
        fVar18 = *(float *)((long)&ec->pred + 8);
        fVar19 = *(float *)((long)&ec->pred + 0xc);
        *(undefined1 (*) [16])((long)ppVar14 + lVar35 + 0x10) =
             *(undefined1 (*) [16])((long)&ec->pred + 0x10);
        pfVar3 = (float *)((long)ppVar14 + lVar35);
        *pfVar3 = fVar40;
        pfVar3[1] = fVar41;
        pfVar3[2] = fVar18;
        pfVar3[3] = fVar19;
        puVar1 = &(ec->super_example_predict).ft_offset;
        *puVar1 = *puVar1 + (ulong)*(uint *)(base + 0xe0);
        lVar35 = lVar35 + 0x20;
      } while (uVar34 << 5 != lVar35);
    }
    peVar46 = (example *)CONCAT44(uVar47,iVar45);
    puVar1 = &(ec->super_example_predict).ft_offset;
    *puVar1 = *puVar1 - (ulong)(uint)(iVar45 * *(int *)(base + 0xe0));
  }
  else {
    (**(code **)(base + 0x40))
              (*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),ec,uVar34,
               *(undefined8 *)(base + 0xe0),ppVar14,1);
  }
  if (n->k != 0) {
    uVar34 = 0;
    do {
      if (n->dropout == true) {
        fVar40 = merand48(&n->xsubi);
        bVar26 = fVar40 < 0.5;
      }
      else {
        bVar26 = false;
      }
      pbVar13[uVar34] = bVar26;
      uVar34 = uVar34 + 1;
    } while (uVar34 < n->k);
  }
  if ((peVar42->passthrough != (features *)0x0) && (n->k != 0)) {
    uVar37 = 1;
    lVar35 = 0;
    uVar34 = 0;
    do {
      if (peVar42->passthrough != (features *)0x0) {
        features::push_back(peVar42->passthrough,*(feature_value *)((long)ppVar29 + lVar35),
                            (ulong)(uVar37 - 1) ^ 0x398d9fda640553);
      }
      if (peVar42->passthrough != (features *)0x0) {
        features::push_back(peVar42->passthrough,*(feature_value *)((long)ppVar14 + lVar35),
                            (ulong)uVar37 ^ 0x398d9fda640553);
      }
      uVar34 = uVar34 + 1;
      lVar35 = lVar35 + 0x20;
      uVar37 = uVar37 + 2;
    } while (uVar34 < n->k);
  }
  if ((0 < iVar7) && (n->k != 0)) {
    uVar34 = 0;
    ppVar29 = ppVar14;
    do {
      if (uVar34 != 0) {
        local_2f0[0] = ' ';
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_288,local_2f0,1);
      }
      poVar27 = std::ostream::_M_insert<unsigned_long>((ulong)local_288);
      local_2f0[0] = ':';
      std::__ostream_insert<char,std::char_traits<char>>(poVar27,local_2f0,1);
      poVar27 = std::ostream::_M_insert<double>((double)ppVar29->scalar);
      local_2f0[0] = ',';
      std::__ostream_insert<char,std::char_traits<char>>(poVar27,local_2f0,1);
      fVar41 = ppVar29->scalar * -2.0 * 1.442695;
      fVar40 = -126.0;
      if (-126.0 <= fVar41) {
        fVar40 = fVar41;
      }
      fVar41 = (fVar40 - (float)(int)fVar40) + (float)(-(uint)(fVar41 < 0.0) & 0x3f800000);
      std::ostream::_M_insert<double>
                ((double)(2.0 / ((float)(long)((fVar41 * -1.4901291 +
                                               27.728024 / (4.8425255 - fVar41) +
                                               fVar40 + 121.274055) * 8388608.0) + 1.0) + -1.0));
      uVar34 = uVar34 + 1;
      ppVar29 = ppVar29 + 1;
    } while (uVar34 < n->k);
  }
  plVar44 = (label_t *)&peVar42->l;
  n->all->loss = plVar12;
  n->all->set_minmax = p_Var11;
  n->all->sd->min_label = fVar49;
  n->all->sd->max_label = fVar48;
  (peVar42->super_example_predict).ft_offset = uVar16;
  ppVar2 = &(n->output_layer).l;
  pfVar5 = (peVar42->super_example_predict).feature_space + 0x81;
  bVar26 = true;
  local_370 = 0.0;
  local_36c = 0.0;
  local_374 = 0.0;
  peVar36 = peVar42;
  peVar43 = peVar42;
  while( true ) {
    (n->output_layer).total_sum_feat_sq = 1.0;
    (n->output_layer).super_example_predict.feature_space[0x81].sum_feat_sq = 1.0;
    (n->outputweight).super_example_predict.ft_offset = (peVar36->super_example_predict).ft_offset;
    n->all->set_minmax = noop_mm;
    n->all->loss = n->squared_loss;
    psVar15 = n->all->sd;
    fVar49 = psVar15->min_label;
    psVar15->min_label = -1.0;
    psVar15 = n->all->sd;
    fVar48 = psVar15->max_label;
    psVar15->max_label = 1.0;
    peVar36 = peVar43;
    if (n->k != 0) {
      uVar34 = 0;
      ppVar29 = ppVar14;
      do {
        fVar40 = 0.0;
        if (pbVar13[uVar34] == false) {
          fVar41 = ppVar29->scalar * -2.0 * 1.442695;
          fVar40 = -126.0;
          if (-126.0 <= fVar41) {
            fVar40 = fVar41;
          }
          fVar41 = (fVar40 - (float)(int)fVar40) + (float)(-(uint)(fVar41 < 0.0) & 0x3f800000);
          fVar40 = (2.0 / ((float)(long)((fVar41 * -1.4901291 +
                                         27.728024 / (4.8425255 - fVar41) + fVar40 + 121.274055) *
                                        8388608.0) + 1.0) + -1.0) * fVar39;
        }
        (n->output_layer).super_example_predict.feature_space[0x81].values._begin[uVar34] = fVar40;
        (n->output_layer).total_sum_feat_sq = (n->output_layer).total_sum_feat_sq + fVar40 * fVar40;
        (n->output_layer).super_example_predict.feature_space[0x81].sum_feat_sq =
             fVar40 * fVar40 +
             (n->output_layer).super_example_predict.feature_space[0x81].sum_feat_sq;
        *(n->outputweight).super_example_predict.feature_space[0x81].indicies._begin =
             (n->output_layer).super_example_predict.feature_space[0x81].indicies._begin[uVar34];
        uVar8 = n->k;
        puVar1 = &(n->outputweight).super_example_predict.ft_offset;
        *puVar1 = *puVar1 + (ulong)(*(int *)(base + 0xe0) * uVar8);
        (**(code **)(base + 0x30))
                  (*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),&n->outputweight);
        uVar47 = (undefined4)((ulong)peVar46 >> 0x20);
        puVar1 = &(n->outputweight).super_example_predict.ft_offset;
        *puVar1 = *puVar1 - (ulong)(uVar8 * *(int *)(base + 0xe0));
        fVar40 = (n->outputweight).pred.scalar;
        if ((fVar40 == 0.0) && (!NAN(fVar40))) {
          fVar40 = (float)n->k;
          if (fVar40 < 0.0) {
            fVar40 = sqrtf(fVar40);
          }
          else {
            fVar40 = SQRT(fVar40);
          }
          fVar41 = merand48(&n->all->random_state);
          (n->outputweight).l.simple.label = (fVar41 + -0.5) / fVar40;
          uVar8 = n->k;
          puVar1 = &(n->outputweight).super_example_predict.ft_offset;
          *puVar1 = *puVar1 + (ulong)(*(int *)(base + 0xe0) * uVar8);
          (**(code **)(base + 0x38))
                    (*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),&n->outputweight);
          peVar46 = (example *)CONCAT44(uVar47,fVar40);
          puVar1 = &(n->outputweight).super_example_predict.ft_offset;
          *puVar1 = *puVar1 - (ulong)(uVar8 * *(int *)(base + 0xe0));
          (n->outputweight).l.multi.label = 0x7f7fffff;
        }
        uVar34 = uVar34 + 1;
        ppVar29 = ppVar29 + 1;
      } while (uVar34 < n->k);
    }
    n->all->loss = plVar12;
    n->all->set_minmax = p_Var11;
    n->all->sd->min_label = fVar49;
    n->all->sd->max_label = fVar48;
    peVar43 = peVar36;
    if (n->inpass == false) {
      (n->output_layer).super_example_predict.ft_offset = (peVar36->super_example_predict).ft_offset
      ;
      (n->output_layer).l.cb_eval.event.costs.erase_count = (size_t)plVar44[4];
      lVar20 = *plVar44;
      lVar21 = plVar44[1];
      lVar22 = plVar44[3];
      (n->output_layer).l.cs.costs.end_array = (wclass *)plVar44[2];
      (n->output_layer).l.cs.costs.erase_count = (size_t)lVar22;
      ppVar2->multi = lVar20;
      (n->output_layer).l.cs.costs._end = (wclass *)lVar21;
      (n->output_layer).weight = peVar36->weight;
      (n->output_layer).partial_prediction = 0.0;
      uVar8 = n->k;
      puVar1 = &(n->output_layer).super_example_predict.ft_offset;
      *puVar1 = *puVar1 + (ulong)(*(int *)(base + 0xe0) * uVar8);
      (**(code **)(base + 0x30))
                (*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),&n->output_layer);
      puVar1 = &(n->output_layer).super_example_predict.ft_offset;
      *puVar1 = *puVar1 - (ulong)(uVar8 * *(int *)(base + 0xe0));
      ppVar24 = &(n->output_layer).l;
      uVar47 = *(undefined4 *)
                ((long)&(((label *)((long)&ppVar24->cb_eval + 8))->costs).erase_count + 4);
      plVar44[4].label =
           *(undefined4 *)&(((label *)((long)&ppVar24->cb_eval + 8))->costs).erase_count;
      plVar44[4].weight = (float)uVar47;
      lVar20 = ppVar2->multi;
      lVar21 = (label_t)(n->output_layer).l.cs.costs._end;
      uVar47 = *(undefined4 *)((long)&(n->output_layer).l + 0x18);
      uVar25 = *(undefined4 *)((long)&(n->output_layer).l + 0x1c);
      plVar44[2] = (label_t)(n->output_layer).l.cs.costs.end_array;
      plVar44[3].label = uVar47;
      plVar44[3].weight = (float)uVar25;
      *plVar44 = lVar20;
      plVar44[1] = lVar21;
    }
    else {
      v_array<unsigned_char>::push_back((v_array<unsigned_char> *)peVar36,&nn_output_namespace);
      pfVar30 = pfVar5;
      pcVar31 = local_2f0;
      for (lVar35 = 0xd; lVar35 != 0; lVar35 = lVar35 + -1) {
        *(float **)pcVar31 = (pfVar30->values)._begin;
        pfVar30 = (features *)((long)pfVar30 + (ulong)bVar38 * -0x10 + 8);
        pcVar31 = pcVar31 + ((ulong)bVar38 * -2 + 1) * 8;
      }
      pfVar30 = (n->output_layer).super_example_predict.feature_space + 0x81;
      pfVar32 = pfVar5;
      for (lVar35 = 0xc; lVar35 != 0; lVar35 = lVar35 + -1) {
        (pfVar32->values)._begin = (pfVar30->values)._begin;
        pfVar30 = (features *)((long)pfVar30 + (ulong)bVar38 * -0x10 + 8);
        pfVar32 = (features *)((long)pfVar32 + (ulong)bVar38 * -0x10 + 8);
      }
      (peVar42->super_example_predict).feature_space[0x81].sum_feat_sq =
           (n->output_layer).super_example_predict.feature_space[0x81].sum_feat_sq;
      peVar36->total_sum_feat_sq =
           (n->output_layer).super_example_predict.feature_space[0x81].sum_feat_sq +
           peVar36->total_sum_feat_sq;
      uVar8 = n->k;
      puVar1 = &(peVar36->super_example_predict).ft_offset;
      *puVar1 = *puVar1 + (ulong)(*(int *)(base + 0xe0) * uVar8);
      (**(code **)(base + 0x30))(*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),peVar36);
      puVar1 = &(peVar36->super_example_predict).ft_offset;
      *puVar1 = *puVar1 - (ulong)(uVar8 * *(int *)(base + 0xe0));
      (n->output_layer).partial_prediction = peVar36->partial_prediction;
      (n->output_layer).loss = peVar36->loss;
      peVar36->total_sum_feat_sq =
           peVar36->total_sum_feat_sq -
           (n->output_layer).super_example_predict.feature_space[0x81].sum_feat_sq;
      (peVar36->super_example_predict).feature_space[0x81].sum_feat_sq = 0.0;
      pcVar31 = local_2f0;
      pfVar30 = pfVar5;
      for (lVar35 = 0xc; lVar35 != 0; lVar35 = lVar35 + -1) {
        (pfVar30->values)._begin = *(float **)pcVar31;
        pcVar31 = pcVar31 + ((ulong)bVar38 * -2 + 1) * 8;
        pfVar30 = (features *)((long)pfVar30 + (ulong)bVar38 * -0x10 + 8);
      }
      (peVar42->super_example_predict).feature_space[0x81].sum_feat_sq = local_290;
      ppuVar4 = &(peVar36->super_example_predict).indices._end;
      *ppuVar4 = *ppuVar4 + -1;
    }
    fVar40 = GD::finalize_prediction(n->all->sd,(n->output_layer).partial_prediction);
    n->prediction = fVar40;
    if (0 < iVar7) {
      local_2f0[0] = ' ';
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_288,local_2f0,1);
      std::ostream::_M_insert<double>((double)(n->output_layer).partial_prediction);
      p_Var17 = n->all->print_text;
      iVar45 = n->all->raw_prediction;
      std::__cxx11::stringbuf::str();
      vVar23._end = (char *)plVar44;
      vVar23._begin = (char *)peVar43;
      vVar23.end_array._0_4_ = (int)peVar46;
      vVar23.end_array._4_4_ = (int)((ulong)peVar46 >> 0x20);
      vVar23.erase_count._0_4_ = fVar48;
      vVar23.erase_count._4_4_ = fVar49;
      (*p_Var17)(iVar45,(string)peVar42->tag,vVar23);
      if (local_310 != local_300) {
        operator_delete(local_310);
      }
    }
    plVar44->label = (uint32_t)fVar6;
    if (bVar26) {
      local_36c = n->prediction;
      local_370 = (n->output_layer).partial_prediction;
      local_374 = (n->output_layer).loss;
    }
    if ((bVar26 & n->dropout) != 1) break;
    bVar26 = false;
    if (n->k != 0) {
      uVar34 = 0;
      do {
        pbVar13[uVar34] = (bool)(pbVar13[uVar34] ^ 1);
        uVar34 = uVar34 + 1;
      } while (uVar34 < n->k);
      bVar26 = false;
    }
  }
  peVar36->partial_prediction = local_370;
  (peVar36->pred).scalar = local_36c;
  peVar36->loss = local_374;
  n->all->sd = psVar10;
  (*n->all->set_minmax)(n->all->sd,local_110.min_label);
  (*n->all->set_minmax)(n->all->sd,local_110.max_label);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_288);
  std::ios_base::~ios_base((ios_base *)(local_288 + 0x70));
  return;
}

Assistant:

void predict_or_learn_multi(nn& n, single_learner& base, example& ec)
{
  bool shouldOutput = n.all->raw_prediction > 0;
  if (!n.finished_setup)
    finish_setup(n, *(n.all));
  shared_data sd;
  memcpy(&sd, n.all->sd, sizeof(shared_data));
  shared_data* save_sd = n.all->sd;
  n.all->sd = &sd;

  label_data ld = ec.l.simple;
  void (*save_set_minmax)(shared_data*, float) = n.all->set_minmax;
  float save_min_label;
  float save_max_label;
  float dropscale = n.dropout ? 2.0f : 1.0f;
  loss_function* save_loss = n.all->loss;

  polyprediction* hidden_units = n.hidden_units_pred;
  polyprediction* hiddenbias_pred = n.hiddenbias_pred;
  bool* dropped_out = n.dropped_out;

  ostringstream outputStringStream;

  n.all->set_minmax = noop_mm;
  n.all->loss = n.squared_loss;
  save_min_label = n.all->sd->min_label;
  n.all->sd->min_label = hidden_min_activation;
  save_max_label = n.all->sd->max_label;
  n.all->sd->max_label = hidden_max_activation;

  uint64_t save_ft_offset = ec.ft_offset;

  if (n.multitask)
    ec.ft_offset = 0;

  n.hiddenbias.ft_offset = ec.ft_offset;

  if (recompute_hidden)
  {
    base.multipredict(n.hiddenbias, 0, n.k, hiddenbias_pred, true);

    for (unsigned int i = 0; i < n.k; ++i)
      // avoid saddle point at 0
      if (hiddenbias_pred[i].scalar == 0)
      {
        n.hiddenbias.l.simple.label = (float)(merand48(n.all->random_state) - 0.5);
        base.learn(n.hiddenbias, i);
        n.hiddenbias.l.simple.label = FLT_MAX;
      }

    base.multipredict(ec, 0, n.k, hidden_units, true);

    for (unsigned int i = 0; i < n.k; ++i) dropped_out[i] = (n.dropout && merand48(n.xsubi) < 0.5);

    if (ec.passthrough)
      for (unsigned int i = 0; i < n.k; ++i)
      {
        add_passthrough_feature(ec, i * 2, hiddenbias_pred[i].scalar);
        add_passthrough_feature(ec, i * 2 + 1, hidden_units[i].scalar);
      }
  }

  if (shouldOutput)
    for (unsigned int i = 0; i < n.k; ++i)
    {
      if (i > 0)
        outputStringStream << ' ';
      outputStringStream << i << ':' << hidden_units[i].scalar << ','
                         << fasttanh(hidden_units[i].scalar);  // TODO: huh, what was going on here?
    }

  n.all->loss = save_loss;
  n.all->set_minmax = save_set_minmax;
  n.all->sd->min_label = save_min_label;
  n.all->sd->max_label = save_max_label;
  ec.ft_offset = save_ft_offset;

  bool converse = false;
  float save_partial_prediction = 0;
  float save_final_prediction = 0;
  float save_ec_loss = 0;

CONVERSE:  // That's right, I'm using goto.  So sue me.

  n.output_layer.total_sum_feat_sq = 1;
  n.output_layer.feature_space[nn_output_namespace].sum_feat_sq = 1;

  n.outputweight.ft_offset = ec.ft_offset;

  n.all->set_minmax = noop_mm;
  n.all->loss = n.squared_loss;
  save_min_label = n.all->sd->min_label;
  n.all->sd->min_label = -1;
  save_max_label = n.all->sd->max_label;
  n.all->sd->max_label = 1;

  for (unsigned int i = 0; i < n.k; ++i)
  {
    float sigmah = (dropped_out[i]) ? 0.0f : dropscale * fasttanh(hidden_units[i].scalar);
    features& out_fs = n.output_layer.feature_space[nn_output_namespace];
    out_fs.values[i] = sigmah;

    n.output_layer.total_sum_feat_sq += sigmah * sigmah;
    out_fs.sum_feat_sq += sigmah * sigmah;

    n.outputweight.feature_space[nn_output_namespace].indicies[0] = out_fs.indicies[i];
    base.predict(n.outputweight, n.k);
    float wf = n.outputweight.pred.scalar;

    // avoid saddle point at 0
    if (wf == 0)
    {
      float sqrtk = sqrt((float)n.k);
      n.outputweight.l.simple.label = (float)(merand48(n.all->random_state) - 0.5) / sqrtk;
      base.update(n.outputweight, n.k);
      n.outputweight.l.simple.label = FLT_MAX;
    }
  }

  n.all->loss = save_loss;
  n.all->set_minmax = save_set_minmax;
  n.all->sd->min_label = save_min_label;
  n.all->sd->max_label = save_max_label;

  if (n.inpass)
  {
    // TODO: this is not correct if there is something in the
    // nn_output_namespace but at least it will not leak memory
    // in that case
    ec.indices.push_back(nn_output_namespace);
    features save_nn_output_namespace = ec.feature_space[nn_output_namespace];
    ec.feature_space[nn_output_namespace] = n.output_layer.feature_space[nn_output_namespace];
    ec.total_sum_feat_sq += n.output_layer.feature_space[nn_output_namespace].sum_feat_sq;
    if (is_learn)
      base.learn(ec, n.k);
    else
      base.predict(ec, n.k);
    n.output_layer.partial_prediction = ec.partial_prediction;
    n.output_layer.loss = ec.loss;
    ec.total_sum_feat_sq -= n.output_layer.feature_space[nn_output_namespace].sum_feat_sq;
    ec.feature_space[nn_output_namespace].sum_feat_sq = 0;
    ec.feature_space[nn_output_namespace] = save_nn_output_namespace;
    ec.indices.pop();
  }
  else
  {
    n.output_layer.ft_offset = ec.ft_offset;
    n.output_layer.l = ec.l;
    n.output_layer.weight = ec.weight;
    n.output_layer.partial_prediction = 0;
    if (is_learn)
      base.learn(n.output_layer, n.k);
    else
      base.predict(n.output_layer, n.k);
    ec.l = n.output_layer.l;
  }

  n.prediction = GD::finalize_prediction(n.all->sd, n.output_layer.partial_prediction);

  if (shouldOutput)
  {
    outputStringStream << ' ' << n.output_layer.partial_prediction;
    n.all->print_text(n.all->raw_prediction, outputStringStream.str(), ec.tag);
  }

  if (is_learn && n.all->training && ld.label != FLT_MAX)
  {
    float gradient = n.all->loss->first_derivative(n.all->sd, n.prediction, ld.label);

    if (fabs(gradient) > 0)
    {
      n.all->loss = n.squared_loss;
      n.all->set_minmax = noop_mm;
      save_min_label = n.all->sd->min_label;
      n.all->sd->min_label = hidden_min_activation;
      save_max_label = n.all->sd->max_label;
      n.all->sd->max_label = hidden_max_activation;
      save_ft_offset = ec.ft_offset;

      if (n.multitask)
        ec.ft_offset = 0;

      for (unsigned int i = 0; i < n.k; ++i)
      {
        if (!dropped_out[i])
        {
          float sigmah = n.output_layer.feature_space[nn_output_namespace].values[i] / dropscale;
          float sigmahprime = dropscale * (1.0f - sigmah * sigmah);
          n.outputweight.feature_space[nn_output_namespace].indicies[0] =
              n.output_layer.feature_space[nn_output_namespace].indicies[i];
          base.predict(n.outputweight, n.k);
          float nu = n.outputweight.pred.scalar;
          float gradhw = 0.5f * nu * gradient * sigmahprime;

          ec.l.simple.label = GD::finalize_prediction(n.all->sd, hidden_units[i].scalar - gradhw);
          ec.pred.scalar = hidden_units[i].scalar;
          if (ec.l.simple.label != hidden_units[i].scalar)
            base.update(ec, i);
        }
      }

      n.all->loss = save_loss;
      n.all->set_minmax = save_set_minmax;
      n.all->sd->min_label = save_min_label;
      n.all->sd->max_label = save_max_label;
      ec.ft_offset = save_ft_offset;
    }
  }

  ec.l.simple.label = ld.label;

  if (!converse)
  {
    save_partial_prediction = n.output_layer.partial_prediction;
    save_final_prediction = n.prediction;
    save_ec_loss = n.output_layer.loss;
  }

  if (n.dropout && !converse)
  {
    for (unsigned int i = 0; i < n.k; ++i)
    {
      dropped_out[i] = !dropped_out[i];
    }

    converse = true;
    goto CONVERSE;
  }

  ec.partial_prediction = save_partial_prediction;
  ec.pred.scalar = save_final_prediction;
  ec.loss = save_ec_loss;

  n.all->sd = save_sd;
  n.all->set_minmax(n.all->sd, sd.min_label);
  n.all->set_minmax(n.all->sd, sd.max_label);
}